

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

void gmath::svd<double,3,3>
               (SMatrix<double,_3,_3> *a,SMatrix<double,_3,_3> *u,SVector<double,_3> *w,
               SMatrix<double,_3,_3> *v)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vectord W;
  SMatrix<double,_3,_3> ret;
  Vectord local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  Matrixd local_50;
  Matrixd local_38;
  long lVar12;
  
  bVar9 = 0;
  local_38.v = (double *)0x0;
  local_38.n = 0;
  local_38.nrows = 0;
  local_38.ncols = 0;
  local_50.v = (double *)0x0;
  local_50.nrows = 0;
  local_50.ncols = 0;
  local_50.n = 0;
  local_a8.n = 0;
  local_a8.v = (double *)0x0;
  local_98._12_4_ = SUB84(local_98._0_8_,4);
  local_98._8_4_ = 9;
  local_98._0_8_ = 0x300000003;
  local_88._0_8_ = operator_new__(0x48);
  pdVar6 = (double *)local_88._0_8_;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar6 = a->v[0][0];
    a = (SMatrix<double,_3,_3> *)((long)a + ((ulong)bVar9 * -2 + 1) * 8);
    pdVar6 = pdVar6 + (ulong)bVar9 * -2 + 1;
  }
  svd((Matrixd *)local_98,&local_38,&local_a8,&local_50,false);
  if ((double *)local_88._0_8_ != (double *)0x0) {
    operator_delete__((void *)local_88._0_8_);
  }
  auVar3 = _DAT_00121080;
  local_68 = ZEXT816(0);
  local_78 = ZEXT816(0);
  local_88 = ZEXT816(0);
  local_98 = ZEXT816(0);
  local_58 = 0;
  lVar5 = 0;
  auVar10 = _DAT_00121070;
  do {
    if (SUB164(auVar10 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar10 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_98 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_78 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  pdVar6 = local_38.v;
  pdVar7 = (double *)local_98;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar7 = *pdVar6;
    pdVar6 = pdVar6 + (ulong)bVar9 * -2 + 1;
    pdVar7 = pdVar7 + (ulong)bVar9 * -2 + 1;
  }
  lVar5 = 0;
  do {
    *(undefined8 *)((long)u->v[0] + lVar5 + 0x10) = *(undefined8 *)(local_88 + lVar5);
    uVar2 = *(undefined8 *)(local_98 + lVar5 + 8);
    puVar1 = (undefined8 *)((long)u->v[0] + lVar5);
    *puVar1 = *(undefined8 *)(local_98 + lVar5);
    puVar1[1] = uVar2;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_58 = 0;
  lVar5 = 0;
  auVar11 = _DAT_00121070;
  do {
    if (SUB164(auVar11 ^ auVar3,4) == -0x80000000 && SUB164(auVar11 ^ auVar3,0) < -0x7ffffffd) {
      *(undefined8 *)(local_98 + lVar5) = 0x3ff0000000000000;
      *(undefined8 *)(local_78 + lVar5) = 0x3ff0000000000000;
    }
    lVar12 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 2;
    auVar11._8_8_ = lVar12 + 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x80);
  pdVar6 = local_50.v;
  pdVar7 = (double *)local_98;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pdVar7 = *pdVar6;
    pdVar6 = pdVar6 + (ulong)bVar9 * -2 + 1;
    pdVar7 = pdVar7 + (ulong)bVar9 * -2 + 1;
  }
  lVar5 = 0;
  do {
    *(undefined8 *)((long)v->v[0] + lVar5 + 0x10) = *(undefined8 *)(local_88 + lVar5);
    uVar2 = *(undefined8 *)(local_98 + lVar5 + 8);
    puVar1 = (undefined8 *)((long)v->v[0] + lVar5);
    *puVar1 = *(undefined8 *)(local_98 + lVar5);
    puVar1[1] = uVar2;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  uVar4 = 3;
  if (local_a8.n < 3) {
    uVar4 = local_a8.n;
  }
  if (0 < (long)local_a8.n) {
    uVar8 = 0;
    do {
      w->v[uVar8] = local_a8.v[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  if (local_a8.n < 3) {
    memset(w->v + local_a8.n,0,(ulong)(2 - uVar4) * 8 + 8);
  }
  if (local_a8.v != (double *)0x0) {
    operator_delete__(local_a8.v);
  }
  if (local_50.v != (double *)0x0) {
    operator_delete__(local_50.v);
  }
  if (local_38.v != (double *)0x0) {
    operator_delete__(local_38.v);
  }
  return;
}

Assistant:

inline void svd(const SMatrix<T, m, n> &a,
    SMatrix<T, m, m> &u, SVector<T, n> &w, SMatrix<T, n, n> &v)
{
  Matrixd U, V;
  Vectord W;

  svd(a, U, W, V, false);
  u=U; v=V;

  int nn=std::min(w.size(), W.size());

  for (int i=0; i<nn; i++)
  {
    w[i]=W[i];
  }

  for (int i=nn; i < w.size(); i++)
  {
    w[i]=0;
  }
}